

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::setFlag(QGraphicsItem *this,GraphicsItemFlag flag,bool enabled)

{
  GraphicsItemFlag GVar1;
  undefined3 in_register_00000011;
  
  GVar1 = *(GraphicsItemFlag *)&((this->d_ptr).d)->field_0x164;
  if (CONCAT31(in_register_00000011,enabled) != 0) {
    setFlags(this,(GraphicsItemFlags)
                  (GVar1 & (ItemContainsChildrenInShape|ItemStopsFocusHandling|
                            ItemStopsClickFocusPropagation|ItemSendsScenePositionChanges|
                            ItemIsFocusScope|ItemIsPanel|ItemNegativeZStacksBehindParent|
                            ItemAcceptsInputMethod|ItemSendsGeometryChanges|ItemHasNoContents|
                            ItemUsesExtendedStyleOption|ItemStacksBehindParent|
                            ItemDoesntPropagateOpacityToChildren|ItemIgnoresParentOpacity|
                            ItemIgnoresTransformations|ItemClipsChildrenToShape|ItemClipsToShape|
                            ItemIsFocusable|ItemIsSelectable|ItemIsMovable) | flag));
    return;
  }
  setFlags(this,(GraphicsItemFlags)
                (~flag & GVar1 &
                (ItemContainsChildrenInShape|ItemStopsFocusHandling|ItemStopsClickFocusPropagation|
                 ItemSendsScenePositionChanges|ItemIsFocusScope|ItemIsPanel|
                 ItemNegativeZStacksBehindParent|ItemAcceptsInputMethod|ItemSendsGeometryChanges|
                 ItemHasNoContents|ItemUsesExtendedStyleOption|ItemStacksBehindParent|
                 ItemDoesntPropagateOpacityToChildren|ItemIgnoresParentOpacity|
                 ItemIgnoresTransformations|ItemClipsChildrenToShape|ItemClipsToShape|
                 ItemIsFocusable|ItemIsSelectable|ItemIsMovable)));
  return;
}

Assistant:

void QGraphicsItem::setFlag(GraphicsItemFlag flag, bool enabled)
{
    if (enabled)
        setFlags(GraphicsItemFlags(d_ptr->flags) | flag);
    else
        setFlags(GraphicsItemFlags(d_ptr->flags) & ~flag);
}